

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

OPJ_BOOL opj_mct_encode_custom
                   (OPJ_BYTE *pCodingdata,OPJ_UINT32 n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  void *pvVar1;
  int *piVar2;
  OPJ_BOOL OVar3;
  void *ptr;
  ulong uVar4;
  long lVar5;
  OPJ_UINT32 OVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  uVar9 = pNbComp * pNbComp;
  ptr = opj_malloc((ulong)(uVar9 + pNbComp) << 2);
  if (ptr == (void *)0x0) {
    OVar3 = 0;
  }
  else {
    uVar4 = (ulong)pNbComp;
    pvVar1 = (void *)((long)ptr + uVar4 * 4);
    if (uVar9 != 0) {
      uVar7 = 0;
      do {
        *(int *)((long)pvVar1 + uVar7 * 4) = (int)(*(float *)(pCodingdata + uVar7 * 4) * 8192.0);
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    if (n != 0) {
      OVar6 = 0;
      do {
        if (pNbComp != 0) {
          uVar7 = 0;
          do {
            *(undefined4 *)((long)ptr + uVar7 * 4) = *(undefined4 *)pData[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
          if (pNbComp != 0) {
            uVar7 = 0;
            pvVar8 = pvVar1;
            do {
              piVar2 = (int *)pData[uVar7];
              *piVar2 = 0;
              lVar11 = 0;
              iVar10 = 0;
              do {
                lVar5 = (long)*(int *)((long)ptr + lVar11) * (long)*(int *)((long)pvVar8 + lVar11) +
                        0x1000 >> 0xd;
                if (0x7fffffff < lVar5) {
                  __assert_fail("(temp >> 13) <= (OPJ_INT64)0x7FFFFFFF",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                ,0xc9,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
                }
                if (lVar5 < -0x80000000) {
                  __assert_fail("(temp >> 13) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                ,0xca,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
                }
                iVar10 = iVar10 + (int)lVar5;
                *piVar2 = iVar10;
                lVar11 = lVar11 + 4;
              } while (uVar4 * 4 - lVar11 != 0);
              pData[uVar7] = (OPJ_BYTE *)(piVar2 + 1);
              uVar7 = uVar7 + 1;
              pvVar8 = (void *)((long)pvVar8 + lVar11);
            } while (uVar7 != uVar4);
          }
        }
        OVar6 = OVar6 + 1;
      } while (OVar6 != n);
    }
    opj_free(ptr);
    OVar3 = 1;
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_mct_encode_custom(
					   OPJ_BYTE * pCodingdata,
					   OPJ_UINT32 n,
					   OPJ_BYTE ** pData,
					   OPJ_UINT32 pNbComp,
					   OPJ_UINT32 isSigned)
{
	OPJ_FLOAT32 * lMct = (OPJ_FLOAT32 *) pCodingdata;
	OPJ_UINT32 i;
	OPJ_UINT32 j;
	OPJ_UINT32 k;
	OPJ_UINT32 lNbMatCoeff = pNbComp * pNbComp;
	OPJ_INT32 * lCurrentData = 00;
	OPJ_INT32 * lCurrentMatrix = 00;
	OPJ_INT32 ** lData = (OPJ_INT32 **) pData;
	OPJ_UINT32 lMultiplicator = 1 << 13;
	OPJ_INT32 * lMctPtr;

    OPJ_ARG_NOT_USED(isSigned);

	lCurrentData = (OPJ_INT32 *) opj_malloc((pNbComp + lNbMatCoeff) * sizeof(OPJ_INT32));
	if (! lCurrentData) {
		return OPJ_FALSE;
	}

	lCurrentMatrix = lCurrentData + pNbComp;

	for (i =0;i<lNbMatCoeff;++i) {
		lCurrentMatrix[i] = (OPJ_INT32) (*(lMct++) * (OPJ_FLOAT32)lMultiplicator);
	}

	for (i = 0; i < n; ++i)  {
		lMctPtr = lCurrentMatrix;
		for (j=0;j<pNbComp;++j) {
			lCurrentData[j] = (*(lData[j]));
		}

		for (j=0;j<pNbComp;++j) {
			*(lData[j]) = 0;
			for (k=0;k<pNbComp;++k) {
				*(lData[j]) += opj_int_fix_mul(*lMctPtr, lCurrentData[k]);
				++lMctPtr;
			}

			++lData[j];
		}
	}

	opj_free(lCurrentData);

	return OPJ_TRUE;
}